

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBarPrivate::setupMovableTab(QTabBarPrivate *this)

{
  Tab *pTVar1;
  bool bVar2;
  int iVar3;
  QTabBar *this_00;
  QStyle *pQVar4;
  const_reference ppTVar5;
  QTabBarPrivate *in_RDI;
  long in_FS_OFFSET;
  double dVar6;
  Tab *pressedTab;
  int taboverlap;
  QTabBar *q;
  QStylePainter p;
  QPixmap grabImage;
  QRect grabRect;
  QStyleOptionTab tab;
  QWidget *in_stack_fffffffffffffea8;
  QStyleOptionTab *in_stack_fffffffffffffeb0;
  QMovableTabWidget *in_stack_fffffffffffffeb8;
  int dx1;
  QTabBarPrivate *r;
  QWidget *in_stack_fffffffffffffee8;
  QSize local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 auStack_a8 [160];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  r = in_RDI;
  this_00 = q_func(in_RDI);
  if (in_RDI->movingTab == (QMovableTabWidget *)0x0) {
    in_stack_fffffffffffffeb8 = (QMovableTabWidget *)operator_new(0x40);
    QMovableTabWidget::QMovableTabWidget
              ((QMovableTabWidget *)in_RDI,(QWidget *)in_stack_fffffffffffffeb8);
    in_RDI->movingTab = in_stack_fffffffffffffeb8;
  }
  pQVar4 = QWidget::style(in_stack_fffffffffffffea8);
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x13,0,this_00);
  local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = (undefined1  [16])QTabBar::tabRect(this_00,iVar3);
  bVar2 = verticalTabs(in_RDI->shape);
  iVar3 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  dx1 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  if (bVar2) {
    QRect::adjust((QRect *)in_RDI,dx1,(int)in_stack_fffffffffffffeb8,iVar3,
                  (int)in_stack_fffffffffffffeb0);
  }
  else {
    QRect::adjust((QRect *)in_RDI,dx1,(int)in_stack_fffffffffffffeb8,iVar3,
                  (int)in_stack_fffffffffffffeb0);
  }
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::size((QRect *)in_RDI);
  QPaintDevice::devicePixelRatio();
  local_e8 = ::operator*((QSize *)in_RDI,(qreal)in_stack_fffffffffffffeb8);
  QPixmap::QPixmap((QPixmap *)&local_e0,(QSize *)&local_e8);
  dVar6 = (double)QPaintDevice::devicePixelRatio();
  QPixmap::setDevicePixelRatio(dVar6);
  QColor::QColor((QColor *)(auStack_a8 + 0x90),transparent);
  QPixmap::fill((QColor *)&local_e0);
  QStylePainter::QStylePainter
            ((QStylePainter *)in_RDI,(QPaintDevice *)in_stack_fffffffffffffeb8,
             (QWidget *)in_stack_fffffffffffffeb0);
  memset(local_b8,0xaa,0xa0);
  QStyleOptionTab::QStyleOptionTab((QStyleOptionTab *)0x6b2743);
  (**(code **)(*(long *)&this_00->super_QWidget + 0x1c8))(this_00,local_b8,in_RDI->pressedIndex);
  auStack_a8._92_4_ = 4;
  bVar2 = verticalTabs(in_RDI->shape);
  if (bVar2) {
    in_stack_fffffffffffffeb0 = (QStyleOptionTab *)auStack_a8;
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffeb0,
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8);
    QRect::moveTopLeft((QRect *)in_stack_fffffffffffffeb0,(QPoint *)in_stack_fffffffffffffea8);
  }
  else {
    in_stack_fffffffffffffea8 = (QWidget *)auStack_a8;
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffeb0,
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8);
    QRect::moveTopLeft((QRect *)in_stack_fffffffffffffeb0,(QPoint *)in_stack_fffffffffffffea8);
  }
  QStylePainter::drawControl
            ((QStylePainter *)in_stack_fffffffffffffeb0,
             (ControlElement)((ulong)in_stack_fffffffffffffea8 >> 0x20),(QStyleOption *)0x6b27fc);
  QPainter::end();
  QMovableTabWidget::setPixmap
            ((QMovableTabWidget *)in_stack_fffffffffffffeb0,(QPixmap *)in_stack_fffffffffffffea8);
  iVar3 = (int)local_c8;
  QWidget::setGeometry(in_stack_fffffffffffffee8,(QRect *)r);
  QWidget::raise(&in_RDI->movingTab->super_QWidget,iVar3);
  iVar3 = in_RDI->pressedIndex;
  ppTVar5 = QList<QTabBarPrivate::Tab_*>::at
                      ((QList<QTabBarPrivate::Tab_*> *)in_stack_fffffffffffffeb0,
                       (qsizetype)in_stack_fffffffffffffea8);
  pTVar1 = *ppTVar5;
  if (pTVar1->leftWidget != (QWidget *)0x0) {
    QWidget::raise(pTVar1->leftWidget,iVar3);
  }
  if (pTVar1->rightWidget != (QWidget *)0x0) {
    QWidget::raise(pTVar1->rightWidget,iVar3);
  }
  if (in_RDI->leftB != (QToolButton *)0x0) {
    QWidget::raise((QWidget *)in_RDI->leftB,iVar3);
  }
  if (in_RDI->rightB != (QToolButton *)0x0) {
    QWidget::raise((QWidget *)in_RDI->rightB,iVar3);
  }
  (**(code **)(*(long *)&in_RDI->movingTab->super_QWidget + 0x68))(in_RDI->movingTab,1);
  QStyleOptionTab::~QStyleOptionTab(in_stack_fffffffffffffeb0);
  QStylePainter::~QStylePainter((QStylePainter *)0x6b2929);
  QPixmap::~QPixmap((QPixmap *)&local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBarPrivate::setupMovableTab()
{
    Q_Q(QTabBar);
    if (!movingTab)
        movingTab = new QMovableTabWidget(q);

    int taboverlap = q->style()->pixelMetric(QStyle::PM_TabBarTabOverlap, nullptr ,q);
    QRect grabRect = q->tabRect(pressedIndex);
    if (verticalTabs(shape))
        grabRect.adjust(0, -taboverlap, 0, taboverlap);
    else
        grabRect.adjust(-taboverlap, 0, taboverlap, 0);

    QPixmap grabImage(grabRect.size() * q->devicePixelRatio());
    grabImage.setDevicePixelRatio(q->devicePixelRatio());
    grabImage.fill(Qt::transparent);
    QStylePainter p(&grabImage, q);

    QStyleOptionTab tab;
    q->initStyleOption(&tab, pressedIndex);
    tab.position = QStyleOptionTab::Moving;
    if (verticalTabs(shape))
        tab.rect.moveTopLeft(QPoint(0, taboverlap));
    else
        tab.rect.moveTopLeft(QPoint(taboverlap, 0));
    p.drawControl(QStyle::CE_TabBarTab, tab);
    p.end();

    movingTab->setPixmap(grabImage);
    movingTab->setGeometry(grabRect);
    movingTab->raise();

    // Re-arrange widget order to avoid overlaps
    const auto &pressedTab = *tabList.at(pressedIndex);
    if (pressedTab.leftWidget)
        pressedTab.leftWidget->raise();
    if (pressedTab.rightWidget)
        pressedTab.rightWidget->raise();
    if (leftB)
        leftB->raise();
    if (rightB)
        rightB->raise();
    movingTab->setVisible(true);
}